

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCInst.c
# Opt level: O2

void MCInst_insert0(MCInst *inst,int index,MCOperand *Op)

{
  MCInst *pMVar1;
  MCOperand *pMVar2;
  anon_union_8_3_2f11d3b5_for_MCOperand_3 aVar3;
  uint8_t uVar4;
  _Bool _Var5;
  uint8_t uVar6;
  undefined1 uVar7;
  uchar uVar8;
  undefined3 uVar9;
  MCInst *pMVar10;
  ulong uVar11;
  
  pMVar10 = (MCInst *)(inst->Operands + inst->size);
  for (uVar11 = (ulong)inst->size; (long)index < (long)uVar11; uVar11 = uVar11 - 1) {
    pMVar1 = (MCInst *)((long)(pMVar10 + 0xffffffffffffffff) + 800);
    uVar4 = pMVar1->size;
    _Var5 = pMVar1->has_imm;
    uVar6 = pMVar1->op1_size;
    uVar7 = pMVar1->field_0x7;
    aVar3 = *(anon_union_8_3_2f11d3b5_for_MCOperand_3 *)
             ((long)(pMVar10 + 0xffffffffffffffff) + 0x328);
    pMVar10->OpcodePub = pMVar1->OpcodePub;
    pMVar10->size = uVar4;
    pMVar10->has_imm = _Var5;
    pMVar10->op1_size = uVar6;
    pMVar10->field_0x7 = uVar7;
    *(anon_union_8_3_2f11d3b5_for_MCOperand_3 *)&pMVar10->Opcode = aVar3;
    pMVar10 = (MCInst *)((long)(pMVar10 + 0xffffffffffffffff) + 800);
  }
  uVar8 = Op->Kind;
  uVar9 = *(undefined3 *)&Op->field_0x5;
  aVar3 = Op->field_2;
  pMVar2 = inst->Operands + index;
  pMVar2->MachineOperandType = Op->MachineOperandType;
  pMVar2->Kind = uVar8;
  *(undefined3 *)&pMVar2->field_0x5 = uVar9;
  pMVar2->field_2 = aVar3;
  inst->size = inst->size + '\x01';
  return;
}

Assistant:

void MCInst_insert0(MCInst *inst, int index, MCOperand *Op)
{
	int i;

	for(i = inst->size; i > index; i--)
		//memcpy(&(inst->Operands[i]), &(inst->Operands[i-1]), sizeof(MCOperand));
		inst->Operands[i] = inst->Operands[i-1];

	inst->Operands[index] = *Op;
	inst->size++;
}